

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

Float __thiscall pbrt::Triangle::PDF(Triangle *this,ShapeSampleContext *ctx,Vector3f *wi)

{
  float fVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  byte bVar11;
  undefined1 auVar12 [16];
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long in_FS_OFFSET;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Float FVar24;
  Point2f PVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 extraout_var [56];
  undefined1 auVar31 [64];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  Point3f PVar52;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  float local_1b8;
  float local_178;
  undefined1 local_148 [256];
  bool local_48;
  Ray local_40;
  undefined1 auVar32 [56];
  
  auVar20._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar20._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar20._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar20._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  uVar3 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
                                                .high),0x10);
  auVar26._0_4_ = (float)uVar3 + auVar20._0_4_;
  auVar26._4_4_ = (float)((ulong)uVar3 >> 0x20) + auVar20._4_4_;
  auVar26._8_4_ = auVar20._8_4_ + 0.0;
  auVar26._12_4_ = auVar20._12_4_ + 0.0;
  auVar22._8_4_ = 0x3f000000;
  auVar22._0_8_ = 0x3f0000003f000000;
  auVar22._12_4_ = 0x3f000000;
  auVar20 = vmulps_avx512vl(auVar26,auVar22);
  uVar3 = vmovlps_avx(auVar20);
  local_148._8_4_ =
       ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  local_148._0_8_ = uVar3;
  FVar24 = SolidAngle(this,(Point3f *)local_148);
  if ((FVar24 < 0.0002) || (6.22 < FVar24)) {
    auVar32 = extraout_var;
    PVar52 = ShapeSampleContext::OffsetRayOrigin(ctx,wi);
    local_40.o.super_Tuple3<pbrt::Point3,_float>.z = PVar52.super_Tuple3<pbrt::Point3,_float>.z;
    auVar31._0_8_ = PVar52.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar31._8_56_ = auVar32;
    local_40.time = ctx->time;
    local_40.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar31._0_16_);
    local_40.d.super_Tuple3<pbrt::Vector3,_float>.z = (wi->super_Tuple3<pbrt::Vector3,_float>).z;
    local_40.d.super_Tuple3<pbrt::Vector3,_float>.x = (wi->super_Tuple3<pbrt::Vector3,_float>).x;
    local_40.d.super_Tuple3<pbrt::Vector3,_float>.y = (wi->super_Tuple3<pbrt::Vector3,_float>).y;
    local_40.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             )0;
    Intersect((optional<pbrt::ShapeIntersection> *)local_148,this,&local_40,INFINITY);
    if ((PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg == '\0') &&
       (iVar13 = __cxa_guard_acquire(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)
                                      ::reg), iVar13 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg,
                 const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0)
      ;
      __cxa_guard_release(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg);
    }
    *(long *)(in_FS_OFFSET + -0xe8) = *(long *)(in_FS_OFFSET + -0xe8) + 1;
    if (local_48 == false) {
      *(long *)(in_FS_OFFSET + -0xf0) = *(long *)(in_FS_OFFSET + -0xf0) + 1;
      fVar50 = 0.0;
    }
    else {
      FVar24 = Area(this);
      if (local_48 == false) {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
      }
      auVar23._8_4_ = 0x80000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar23._12_4_ = 0x80000000;
      auVar22 = ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).z);
      auVar20 = vxorps_avx512vl(auVar22,auVar23);
      auVar26 = ZEXT416((uint)((float)local_148._48_4_ * auVar20._0_4_));
      auVar20 = vfnmadd132ss_fma(ZEXT416((uint)local_148._44_4_),auVar26,
                                 ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).y));
      auVar22 = vfnmsub213ss_fma(auVar22,ZEXT416((uint)local_148._48_4_),auVar26);
      auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ + auVar22._0_4_)),
                                 ZEXT416((uint)local_148._40_4_),
                                 ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).x));
      auVar21._8_4_ = 0x7fffffff;
      auVar21._0_8_ = 0x7fffffff7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx512vl(auVar20,auVar21);
      fVar50 = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low +
               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high) * 0.5 -
               ((float)local_148._8_4_ + (float)local_148._12_4_) * 0.5;
      auVar20 = ZEXT416((uint)(((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low +
                               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high) * 0.5 -
                              ((float)local_148._0_4_ + (float)local_148._4_4_) * 0.5));
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar50)),auVar20,auVar20);
      auVar26 = ZEXT416((uint)(((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 -
                              ((float)local_148._16_4_ + (float)local_148._20_4_) * 0.5));
      auVar20 = vfmadd231ss_fma(auVar20,auVar26,auVar26);
      fVar50 = (1.0 / FVar24) / (auVar22._0_4_ / auVar20._0_4_);
      fVar50 = (float)((uint)(ABS(fVar50) != INFINITY) * (int)fVar50);
    }
  }
  else {
    fVar50 = 1.0 / FVar24;
    if (((((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
         ((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y != 0.0)) ||
        (fVar1 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z, fVar1 != 0.0)) || (NAN(fVar1))) {
      lVar6 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
      lVar14 = (long)this->triIndex;
      lVar15 = *(long *)(lVar6 + 8);
      lVar6 = *(long *)(lVar6 + 0x10);
      lVar16 = (long)*(int *)(lVar15 + lVar14 * 0xc);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *(ulong *)(lVar6 + 4 + lVar16 * 0xc);
      lVar17 = (long)*(int *)(lVar15 + 4 + lVar14 * 0xc);
      lVar15 = (long)*(int *)(lVar15 + 8 + lVar14 * 0xc);
      uVar4 = *(ulong *)(lVar6 + 4 + lVar17 * 0xc);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar4;
      uVar5 = *(ulong *)(lVar6 + lVar15 * 0xc);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar5;
      fVar1 = *(float *)(lVar6 + 8 + lVar15 * 0xc);
      uVar2 = *(uint *)(lVar6 + lVar17 * 0xc);
      auVar34 = ZEXT416(*(uint *)(lVar6 + lVar16 * 0xc));
      auVar20 = vpermi2ps_avx512vl(_DAT_004bc990,auVar42,auVar34);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(uVar2),0x30);
      auVar36._16_8_ = uVar4;
      auVar36._0_16_ = auVar20;
      auVar36._24_8_ = 0;
      auVar22 = vmovshdup_avx(auVar47);
      auVar30._16_8_ = uVar5;
      auVar30._0_16_ = auVar20;
      auVar30._24_8_ = 0;
      local_148._0_32_ = vshufpd_avx(auVar36,auVar30,2);
      auVar49._0_4_ =
           (ctx->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
      auVar49._4_4_ =
           (ctx->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar49._8_4_ =
           (ctx->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      auVar49._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      uVar3 = *(undefined8 *)
               &(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar20 = vinsertps_avx(auVar49,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.high),0x10);
      auVar27._0_4_ = (float)uVar3 + auVar20._0_4_;
      auVar27._4_4_ = (float)((ulong)uVar3 >> 0x20) + auVar20._4_4_;
      auVar27._8_4_ = auVar20._8_4_ + 0.0;
      auVar27._12_4_ = auVar20._12_4_ + 0.0;
      auVar8._8_4_ = 0x3f000000;
      auVar8._0_8_ = 0x3f0000003f000000;
      auVar8._12_4_ = 0x3f000000;
      auVar20 = vmulps_avx512vl(auVar27,auVar8);
      local_40.o.super_Tuple3<pbrt::Point3,_float>.z =
           ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
           (ctx->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
      local_40.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar20);
      local_148._32_4_ = fVar1;
      PVar25 = InvertSphericalTriangleSample
                         ((array<pbrt::Point3<float>,_3> *)local_148,&local_40.o,wi);
      fVar19 = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low +
               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high) * 0.5;
      auVar7._0_4_ = (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      auVar7._4_4_ = (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      auVar7._8_4_ = (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
      auVar7._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
      local_1b8 = (float)uVar5;
      local_1b8 = local_1b8 - fVar19;
      uVar3 = *(undefined8 *)
               &(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      auVar20 = vinsertps_avx(auVar7,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .z.high),0x10);
      auVar28._0_4_ = (float)uVar3 + auVar20._0_4_;
      auVar28._4_4_ = (float)((ulong)uVar3 >> 0x20) + auVar20._4_4_;
      auVar28._8_4_ = auVar20._8_4_ + 0.0;
      auVar28._12_4_ = auVar20._12_4_ + 0.0;
      auVar9._8_4_ = 0x3f000000;
      auVar9._0_8_ = 0x3f0000003f000000;
      auVar9._12_4_ = 0x3f000000;
      auVar21 = vmulps_avx512vl(auVar28,auVar9);
      auVar23 = vsubps_avx(auVar42,auVar21);
      auVar26 = vmovshdup_avx(auVar23);
      local_178 = auVar22._0_4_;
      local_178 = local_178 - auVar21._0_4_;
      auVar20 = vmovshdup_avx(auVar21);
      fVar1 = fVar1 - auVar20._0_4_;
      auVar49 = vfmadd231ss_fma(ZEXT416((uint)(local_178 * local_178)),ZEXT416((uint)local_1b8),
                                ZEXT416((uint)local_1b8));
      auVar21 = vsubps_avx(auVar37,auVar21);
      auVar22 = vmovshdup_avx(auVar21);
      auVar20 = vinsertps_avx(auVar34,ZEXT416(uVar2),0x10);
      auVar34._4_4_ = fVar19;
      auVar34._0_4_ = fVar19;
      auVar34._8_4_ = fVar19;
      auVar34._12_4_ = fVar19;
      auVar20 = vsubps_avx(auVar20,auVar34);
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ * auVar23._0_4_)),auVar20,auVar20);
      auVar26 = vfmadd231ss_fma(auVar7,auVar26,auVar26);
      if (auVar26._0_4_ < 0.0) {
        fVar19 = sqrtf(auVar26._0_4_);
        auVar49 = ZEXT416(auVar49._0_4_);
      }
      else {
        auVar26 = vsqrtss_avx(auVar26,auVar26);
        fVar19 = auVar26._0_4_;
      }
      auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
      auVar39._4_4_ = fVar19;
      auVar39._0_4_ = fVar19;
      auVar39._8_4_ = fVar19;
      auVar39._12_4_ = fVar19;
      auVar26 = vmovshdup_avx(auVar20);
      auVar26 = vfmadd213ss_fma(auVar26,auVar26,ZEXT416((uint)(auVar21._0_4_ * auVar21._0_4_)));
      auVar22 = vfmadd213ss_fma(auVar22,auVar22,auVar26);
      if (auVar22._0_4_ < 0.0) {
        fVar19 = sqrtf(auVar22._0_4_);
        auVar49 = ZEXT416(auVar49._0_4_);
      }
      else {
        auVar22 = vsqrtss_avx(auVar22,auVar22);
        fVar19 = auVar22._0_4_;
      }
      auVar26 = vdivps_avx(auVar23,auVar39);
      auVar29._4_4_ = fVar19;
      auVar29._0_4_ = fVar19;
      auVar29._8_4_ = fVar19;
      auVar29._12_4_ = fVar19;
      auVar22 = vblendps_avx(auVar39,auVar29,2);
      auVar20 = vdivps_avx(auVar20,auVar22);
      auVar22 = vdivps_avx(auVar21,auVar29);
      if (auVar49._0_4_ < 0.0) {
        fVar19 = sqrtf(auVar49._0_4_);
      }
      else {
        auVar23 = vsqrtss_avx(auVar49,auVar49);
        fVar19 = auVar23._0_4_;
      }
      auVar12._8_8_ = extraout_XMM0_Qb;
      auVar12._0_4_ = PVar25.super_Tuple2<pbrt::Point2,_float>.x;
      auVar12._4_4_ = PVar25.super_Tuple2<pbrt::Point2,_float>.y;
      uVar4._0_4_ = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
      uVar4._4_4_ = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar4;
      auVar35._0_4_ = auVar22._0_4_ * (float)(undefined4)uVar4;
      auVar35._4_4_ = auVar22._4_4_ * (float)uVar4._4_4_;
      auVar35._8_4_ = auVar22._8_4_ * 0.0;
      auVar35._12_4_ = auVar22._12_4_ * 0.0;
      uVar5 = CONCAT44(auVar35._4_4_,auVar35._0_4_);
      auVar43._0_8_ = uVar5 ^ 0x8000000080000000;
      auVar43._8_4_ = -auVar35._8_4_;
      auVar43._12_4_ = -auVar35._12_4_;
      auVar23 = vpermt2ps_avx512vl(auVar35,_DAT_004bc9a0,auVar43);
      auVar22 = vfmadd231ps_fma(auVar23,auVar38,auVar22);
      auVar44._0_4_ = auVar26._0_4_ * (float)(undefined4)uVar4;
      auVar44._4_4_ = auVar26._4_4_ * (float)uVar4._4_4_;
      auVar44._8_4_ = auVar26._8_4_ * 0.0;
      auVar44._12_4_ = auVar26._12_4_ * 0.0;
      uVar4 = CONCAT44(auVar44._4_4_,auVar44._0_4_);
      auVar40._0_8_ = uVar4 ^ 0x8000000080000000;
      auVar40._8_4_ = -auVar44._8_4_;
      auVar40._12_4_ = -auVar44._12_4_;
      auVar23 = vpermt2ps_avx512vl(auVar44,_DAT_004bc9a0,auVar40);
      auVar26 = vfmadd231ps_fma(auVar23,auVar38,auVar26);
      auVar22 = vhaddps_avx(auVar26,auVar22);
      auVar22 = vshufps_avx(auVar22,auVar22,0xe8);
      fVar46 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x;
      auVar41._4_4_ = fVar46;
      auVar41._0_4_ = fVar46;
      auVar41._8_4_ = fVar46;
      auVar41._12_4_ = fVar46;
      auVar20 = vfmadd213ps_fma(auVar20,auVar41,auVar22);
      auVar45._8_4_ = 0x7fffffff;
      auVar45._0_8_ = 0x7fffffff7fffffff;
      auVar45._12_4_ = 0x7fffffff;
      auVar20 = vandps_avx(auVar20,auVar45);
      auVar10._8_4_ = 0x3c23d70a;
      auVar10._0_8_ = 0x3c23d70a3c23d70a;
      auVar10._12_4_ = 0x3c23d70a;
      uVar4 = vcmpps_avx512vl(auVar20,auVar10,0xe);
      fVar46 = 0.0;
      fVar51 = PVar25.super_Tuple2<pbrt::Point2,_float>.x;
      if ((0.0 <= fVar51) && (fVar51 <= 1.0)) {
        auVar22 = vmovshdup_avx(auVar12);
        fVar33 = auVar22._0_4_;
        if ((0.0 <= fVar33) && (fVar33 <= 1.0)) {
          auVar48._0_4_ = local_1b8 / fVar19;
          auVar48._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar22 = vmovshdup_avx(auVar38);
          bVar11 = (byte)(uVar4 >> 1);
          auVar26 = vshufps_avx(auVar20,auVar20,0xf5);
          fVar18 = (float)((uint)(bVar11 & 1) * auVar26._0_4_ +
                          (uint)!(bool)(bVar11 & 1) * 0x3c23d70a);
          auVar23 = ZEXT416((uint)((fVar1 / fVar19) * auVar22._0_4_));
          auVar26 = vfmadd213ss_fma(ZEXT416((uint)(local_178 / fVar19)),auVar38,auVar23);
          auVar22 = vfmsub213ss_fma(ZEXT416((uint)(fVar1 / fVar19)),auVar22,auVar23);
          auVar22 = vfmadd231ss_fma(ZEXT416((uint)(auVar26._0_4_ + auVar22._0_4_)),auVar41,auVar48);
          auVar22 = vandps_avx(auVar22,auVar45);
          auVar22 = vmaxss_avx(auVar22,SUB6416(ZEXT464(0x3c23d70a),0));
          fVar19 = (float)((uint)((byte)uVar4 & 1) * auVar20._0_4_ +
                          (uint)!(bool)((byte)uVar4 & 1) * 0x3c23d70a);
          fVar1 = fVar18 + fVar18 + fVar19 + auVar22._0_4_;
          fVar46 = 1.0;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * (1.0 - fVar33) * fVar18)),
                                      ZEXT416((uint)fVar18),
                                      ZEXT416((uint)((1.0 - fVar51) * (1.0 - fVar33))));
            auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar19),ZEXT416((uint)(fVar33 * (1.0 - fVar51)))
                                      ,auVar20);
            auVar20 = vfmadd213ss_fma(auVar22,ZEXT416((uint)(fVar51 * fVar33)),auVar20);
            fVar46 = (auVar20._0_4_ * 4.0) / fVar1;
          }
        }
      }
      fVar50 = fVar50 * fVar46;
    }
  }
  return fVar50;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, const Vector3f &wi) const {
        Float solidAngle = SolidAngle(ctx.p());
        // Return PDF based on uniform area sampling for challenging triangles
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Intersect sample ray with shape geometry
            Ray ray = ctx.SpawnRay(wi);
            pstd::optional<ShapeIntersection> isect = Intersect(ray);
            CHECK_RARE(1e-6, !isect.has_value());
            if (!isect)
                return 0;

            // Compute PDF in solid angle measure from shape intersection point
            Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
            if (IsInf(pdf))
                pdf = 0;

            return pdf;
        }

        Float pdf = 1 / solidAngle;
        // Adjust PDF for warp product sampling of triangle $\cos \theta$ factor
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Get triangle vertices in _p0_, _p1_, and _p2_
            const TriangleMesh *mesh = GetMesh();
            const int *v = &mesh->vertexIndices[3 * triIndex];
            Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

            Point2f u = InvertSphericalTriangleSample({p0, p1, p2}, ctx.p(), wi);
            // Compute $\cos \theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            pdf *= BilinearPDF(u, w);
        }

        return pdf;
    }